

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall QMarkdownTextEdit::duplicateText(QMarkdownTextEdit *this)

{
  MoveMode MVar1;
  MoveMode MVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTextCursor cursor;
  QString selectedText;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  if (selectedText.d.size == 0) {
    iVar3 = QTextCursor::position();
    QTextCursor::movePosition((MoveOperation)&cursor,4,0);
    QTextCursor::movePosition((MoveOperation)&cursor,0xf,1);
    iVar4 = QTextCursor::position();
    QTextCursor::selectedText();
    operator+((QString *)&local_38,"\n",(QString *)&local_50);
    QString::operator=(&selectedText,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    MVar1 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)&cursor,MVar1);
    QTextCursor::insertText((QString *)&cursor);
    iVar5 = QTextCursor::position();
    QTextCursor::setPosition((int)&cursor,(iVar3 - iVar4) + iVar5);
  }
  else {
    MVar1 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)&cursor,MVar1);
    MVar1 = QTextCursor::position();
    QTextCursor::insertText((QString *)&cursor);
    MVar2 = QTextCursor::position();
    QTextCursor::setPosition((int)&cursor,MVar1);
    QTextCursor::setPosition((int)&cursor,MVar2);
  }
  QPlainTextEdit::setTextCursor((QTextCursor *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&selectedText.d);
  QTextCursor::~QTextCursor(&cursor);
  return;
}

Assistant:

void QMarkdownTextEdit::duplicateText() {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    // duplicate line if no text was selected
    if (selectedText.isEmpty()) {
        const int position = cursor.position();

        // select the whole line
        cursor.movePosition(QTextCursor::StartOfBlock);
        cursor.movePosition(QTextCursor::EndOfBlock, QTextCursor::KeepAnchor);

        const int positionDiff = cursor.position() - position;
        selectedText = "\n" + cursor.selectedText();

        // insert text with new line at end of the selected line
        cursor.setPosition(cursor.selectionEnd());
        cursor.insertText(selectedText);

        // set the position to same position it was in the duplicated line
        cursor.setPosition(cursor.position() - positionDiff);
    } else {
        // duplicate selected text
        cursor.setPosition(cursor.selectionEnd());
        const int selectionStart = cursor.position();

        // insert selected text
        cursor.insertText(selectedText);
        const int selectionEnd = cursor.position();

        // select the inserted text
        cursor.setPosition(selectionStart);
        cursor.setPosition(selectionEnd, QTextCursor::KeepAnchor);
    }

    this->setTextCursor(cursor);
}